

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mctools_dirname(mcu8str *__return_storage_ptr__,mcu8str *pathraw)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  mcu8str_size_t prealloc_size;
  mcu8str path;
  mcu8str local_40;
  
  mctools_impl_view_no_winnamespace(&local_40,pathraw);
  cVar1 = mctools_drive_letter(&local_40);
  pcVar2 = local_40.c_str;
  if (cVar1 != '\0') {
    pcVar2 = local_40.c_str + 2;
  }
  if (pcVar2 == local_40.c_str + local_40.size) {
LAB_00108305:
    if (cVar1 == '\0') {
      __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
      __return_storage_ptr__->size = 0;
      __return_storage_ptr__->buflen = 0;
      __return_storage_ptr__->owns_memory = 0;
      return __return_storage_ptr__;
    }
LAB_0010830a:
    mcu8str_create_from_cstr(__return_storage_ptr__,"::");
    *__return_storage_ptr__->c_str = cVar1;
  }
  else {
    pcVar3 = local_40.c_str + local_40.size;
    do {
      pcVar3 = pcVar3 + -1;
      if ((pcVar3 <= pcVar2) || (*pcVar3 == '\\')) break;
    } while (*pcVar3 != '/');
    do {
      pcVar4 = pcVar3;
      if (pcVar4 <= pcVar2) break;
      pcVar3 = pcVar4 + -1;
    } while ((pcVar4[-1] == '/') || (pcVar4[-1] == '\\'));
    if ((pcVar4 == pcVar2) && ((*pcVar2 == '\\' || (pcVar4 = pcVar2, *pcVar2 == '/')))) {
      pcVar4 = pcVar2 + 1;
    }
    prealloc_size = (long)pcVar4 - (long)pcVar2;
    if ((prealloc_size == 1) && (*pcVar2 == '.')) {
      if (cVar1 != '\0') goto LAB_0010830a;
    }
    else {
      if (pcVar4 != pcVar2) {
        if (cVar1 == '\0') {
          mcu8str_create(__return_storage_ptr__,prealloc_size);
          pcVar2 = __return_storage_ptr__->c_str;
          memcpy(pcVar2,local_40.c_str,prealloc_size);
          pcVar2[prealloc_size] = '\0';
        }
        else {
          mcu8str_create(__return_storage_ptr__,prealloc_size + 2);
          pcVar2 = __return_storage_ptr__->c_str;
          *pcVar2 = cVar1;
          pcVar2[1] = ':';
          memcpy(pcVar2 + 2,local_40.c_str + 2,prealloc_size);
          pcVar2[prealloc_size + 2] = '\0';
          prealloc_size = (mcu8str_size_t)((int)prealloc_size + 2);
        }
        __return_storage_ptr__->size = (uint)prealloc_size;
        mctools_pathseps_platform(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      if ((cVar1 != '\0') || (*local_40.c_str != '.')) goto LAB_00108305;
    }
    mcu8str_create_from_cstr(__return_storage_ptr__,".");
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_dirname( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    char drive_letter = mctools_drive_letter( &path );
    const char * itB = path.c_str;
    const char * itE = path.c_str + path.size;
    if ( drive_letter )
      itB += 2;//ignore drive letter while analysing

    if ( itB == itE ) {
      //empty:
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }

    //Find last path sep, skipping consecutive separatorss:
    const char * it0 = itB;
    //const char * itB = ( drive_letter ? it0 + 2 : it0 );
    const char * it = (itE-1);//start at last

    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    //it is now at the last path sep:
    while ( it > itB && ( *(it-1)=='/' || *(it-1)=='\\' ) )
      --it;

    //If this turned a path starting with a path sep into an empty path, add
    //back a single slash (so that dirname("/")="/" and not ""):
    if ( it == itB && ( *it == '/' || *it == '\\' ) )
      ++it;

    //Apart from a potential drive_letter, the string at [it0,it) is now the
    //result:
    mcu8str_size_t ressize = (mcu8str_size_t)(it-it0);

    if ( ressize == 1 && *it0 == '.' ) {
      //special case, "." or "D:."
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_from_cstr(".");
      }
    }

    if ( ressize == 0 ) {
      if ( path.c_str[0] == '.' && !drive_letter )
        return mcu8str_create_from_cstr(".");
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }
    if ( drive_letter ) {
      mcu8str res = mcu8str_create( ressize + 2 );
      res.c_str[0] = drive_letter;
      res.c_str[1] = ':';
      STDNS memcpy( res.c_str + 2, it0, ressize );
      res.c_str[ressize+2] = '\0';
      res.size = (unsigned)ressize+2;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    } else {
      mcu8str res = mcu8str_create( ressize );
      STDNS memcpy( res.c_str, it0, ressize );
      res.c_str[ressize] = '\0';
      res.size = (unsigned)ressize;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    }
  }